

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVH.cpp
# Opt level: O2

VectorMax3d * __thiscall
SimpleBVH::BVH::point_callback(VectorMax3d *__return_storage_ptr__,BVH *this,int f)

{
  CoeffReturnType piVar1;
  DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
  local_58 [56];
  
  if ((this->getPoint).super__Function_base._M_manager == (_Manager_type)0x0) {
    if (((this->faces).super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>.m_storage.
         m_cols & 0xfffffffffffffffeU) != 2) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                    ,0x238,"VectorMax3d SimpleBVH::BVH::point_callback(int) const");
    }
    piVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_0> *)&this->faces,
                        (long)f,0);
    Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_58,
               &this->vertices,(long)*piVar1);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,3,1>> *)__return_storage_ptr__,local_58)
    ;
  }
  else {
    std::function<Eigen::Matrix<double,_-1,_1,_0,_3,_1>_(int)>::operator()
              (__return_storage_ptr__,&this->getPoint,f);
  }
  return __return_storage_ptr__;
}

Assistant:

VectorMax3d BVH::point_callback(int f) const
{
    if (getPoint) {
        return getPoint(f);
    }

    if (faces.cols() == 2 || faces.cols() == 3) {
        return vertices.row(faces(f, 0));
    }

    assert(false);
    return VectorMax3d(3);
}